

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RigidBody.cpp
# Opt level: O0

bool __thiscall OpenMD::RigidBody::getAtomPos(RigidBody *this,Vector3d *pos,Atom *atom)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  size_type __n;
  StuntDouble *in_RDX;
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  in_RDI;
  Vector3d *in_stack_00000010;
  StuntDouble *in_stack_00000018;
  Vector3d ref;
  iterator i;
  vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  Atom **in_stack_ffffffffffffff58;
  StuntDouble *this_00;
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  in_stack_ffffffffffffff68;
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  local_28;
  StuntDouble *local_20;
  
  local_20 = in_RDX;
  __gnu_cxx::
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  ::__normal_iterator(&local_28);
  std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::begin(in_stack_ffffffffffffff48);
  std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::end(in_stack_ffffffffffffff48);
  local_28 = std::
             find<__gnu_cxx::__normal_iterator<OpenMD::Atom**,std::vector<OpenMD::Atom*,std::allocator<OpenMD::Atom*>>>,OpenMD::Atom*>
                       (in_stack_ffffffffffffff68,in_RDI,in_stack_ffffffffffffff58);
  std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::end(in_stack_ffffffffffffff48);
  bVar1 = __gnu_cxx::operator!=
                    ((__normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
                      *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                     (__normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
                      *)in_stack_ffffffffffffff48);
  if (bVar1) {
    this_00 = (StuntDouble *)
              &(((StuntDouble *)((long)in_RDI._M_current + 0xf0))->properties_).propMap_._M_t.
               _M_impl.super__Rb_tree_header._M_header._M_right;
    std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::begin(in_stack_ffffffffffffff48);
    __n = __gnu_cxx::operator-
                    ((__normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
                      *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                     (__normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
                      *)in_stack_ffffffffffffff48);
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::operator[]
              ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)this_00
               ,__n);
    StuntDouble::body2Lab(in_stack_00000018,in_stack_00000010);
    StuntDouble::getPos(this_00);
    OpenMD::operator+((Vector<double,_3U> *)this_00,
                      (Vector<double,_3U> *)
                      CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
    Vector3<double>::operator=
              ((Vector3<double> *)this_00,
               (Vector<double,_3U> *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  }
  else {
    uVar2 = StuntDouble::getGlobalIndex(local_20);
    uVar3 = StuntDouble::getGlobalIndex((StuntDouble *)in_RDI._M_current);
    snprintf(painCave.errMsg,2000,"Atom %d does not belong to rigid body %d.\n",(ulong)uVar2,
             (ulong)uVar3);
    painCave.isFatal = 0;
    simError();
  }
  return bVar1;
}

Assistant:

bool RigidBody::getAtomPos(Vector3d& pos, Atom* atom) {
    std::vector<Atom*>::iterator i;
    i = std::find(atoms_.begin(), atoms_.end(), atom);
    if (i != atoms_.end()) {
      // RigidBody class makes sure refCoords_ and atoms_ match each other
      Vector3d ref = body2Lab(refCoords_[i - atoms_.begin()]);
      pos          = getPos() + ref;
      return true;
    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "Atom %d does not belong to rigid body %d.\n",
               atom->getGlobalIndex(), getGlobalIndex());
      painCave.isFatal = 0;
      simError();
      return false;
    }
  }